

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O0

void oonf_timer_start_ext(oonf_timer_instance *timer,uint64_t first,uint64_t interval)

{
  char *pcVar1;
  oonf_log_source source;
  int iVar2;
  char *pcVar3;
  uint64_t local_90;
  undefined1 local_88 [8];
  isonumber_str timebuf1;
  uint64_t interval_local;
  uint64_t first_local;
  oonf_timer_instance *timer_local;
  
  timebuf1.buf._40_8_ = interval;
  if (timer->_clock == 0) {
    (timer->_node).key = timer;
    timer->class->_stat_usage = timer->class->_stat_usage + 1;
  }
  else {
    avl_remove(&_timer_tree,&timer->_node);
    timer->class->_stat_changes = timer->class->_stat_changes + 1;
  }
  if ((timer->_random == 0) && (iVar2 = os_core_linux_get_random(&timer->_random,4), iVar2 != 0)) {
    if ((log_global_mask[_oonf_timer_subsystem.logging] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0xb3,
               (void *)0x0,0,"Could not get random data");
    }
    timer->_random = 0;
  }
  _calc_clock(timer,first);
  if ((timer->class->periodic & 1U) == 0) {
    local_90 = 0;
  }
  else {
    local_90._0_1_ = timebuf1.buf[0x28];
    local_90._1_1_ = timebuf1.buf[0x29];
    local_90._2_1_ = timebuf1.buf[0x2a];
    local_90._3_1_ = timebuf1.buf[0x2b];
    local_90._4_1_ = timebuf1.buf[0x2c];
    local_90._5_1_ = timebuf1.buf[0x2d];
    local_90._6_1_ = timebuf1.buf[0x2e];
    local_90._7_1_ = timebuf1.buf[0x2f];
  }
  timer->_period = local_90;
  avl_insert(&_timer_tree,&timer->_node);
  source = _oonf_timer_subsystem.logging;
  if ((log_global_mask[_oonf_timer_subsystem.logging] & 1) != 0) {
    pcVar1 = timer->class->name;
    pcVar3 = oonf_clock_toClockString((isonumber_str *)local_88,first);
    oonf_log(LOG_SEVERITY_DEBUG,source,"src/base/oonf_timer.c",0xc2,(void *)0x0,0,
             "TIMER: start timer \'%s\' firing in %s (%lu)\n",pcVar1,pcVar3,timer->_clock);
  }
  return;
}

Assistant:

void
oonf_timer_start_ext(struct oonf_timer_instance *timer, uint64_t first, uint64_t interval) {
#ifdef OONF_LOG_DEBUG_INFO
  struct isonumber_str timebuf1;
#endif

  if (timer->_clock) {
    avl_remove(&_timer_tree, &timer->_node);
    timer->class->_stat_changes++;
  }
  else {
    timer->_node.key = timer;
    timer->class->_stat_usage++;
  }

  /*
   * Compute random numbers only once.
   */
  if (!timer->_random) {
    if (os_core_get_random(&timer->_random, sizeof(timer->_random))) {
      OONF_WARN(LOG_TIMER, "Could not get random data");
      timer->_random = 0;
    }
  }

  /* Fill entry */
  _calc_clock(timer, first);

  /* Singleshot or periodical timer ? */
  timer->_period = timer->class->periodic ? interval : 0;

  /* insert into tree */
  avl_insert(&_timer_tree, &timer->_node);

  OONF_DEBUG(LOG_TIMER, "TIMER: start timer '%s' firing in %s (%" PRIu64 ")\n", timer->class->name,
    oonf_clock_toClockString(&timebuf1, first), timer->_clock);
}